

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.cpp
# Opt level: O0

void __thiscall spvtools::opt::IRContext::AnalyzeUses(IRContext *this,Instruction *inst)

{
  bool bVar1;
  Op OVar2;
  DefUseManager *this_00;
  DecorationManager *this_01;
  DebugInfoManager *this_02;
  pointer this_03;
  uint32_t local_2c;
  pair<const_unsigned_int,_spvtools::opt::Instruction_*> local_28;
  Instruction *local_18;
  Instruction *inst_local;
  IRContext *this_local;
  
  local_18 = inst;
  inst_local = (Instruction *)this;
  bVar1 = AreAnalysesValid(this,kAnalysisBegin);
  if (bVar1) {
    this_00 = get_def_use_mgr(this);
    analysis::DefUseManager::AnalyzeInstUse(this_00,local_18);
  }
  bVar1 = AreAnalysesValid(this,kAnalysisDecorations);
  if ((bVar1) && (bVar1 = Instruction::IsDecoration(local_18), bVar1)) {
    this_01 = get_decoration_mgr(this);
    analysis::DecorationManager::AddDecoration(this_01,local_18);
  }
  bVar1 = AreAnalysesValid(this,kAnalysisDebugInfo);
  if (bVar1) {
    this_02 = get_debug_info_mgr(this);
    analysis::DebugInfoManager::AnalyzeDebugInst(this_02,local_18);
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->id_to_name_);
  if ((bVar1) &&
     ((OVar2 = Instruction::opcode(local_18), OVar2 == OpName ||
      (OVar2 = Instruction::opcode(local_18), OVar2 == OpMemberName)))) {
    this_03 = std::
              unique_ptr<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>,_std::default_delete<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_>_>
              ::operator->(&this->id_to_name_);
    local_2c = Instruction::GetSingleWordInOperand(local_18,0);
    std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>::
    pair<unsigned_int,_spvtools::opt::Instruction_*&,_true>(&local_28,&local_2c,&local_18);
    std::
    multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
    ::insert(this_03,&local_28);
  }
  return;
}

Assistant:

void IRContext::AnalyzeUses(Instruction* inst) {
  if (AreAnalysesValid(kAnalysisDefUse)) {
    get_def_use_mgr()->AnalyzeInstUse(inst);
  }
  if (AreAnalysesValid(kAnalysisDecorations)) {
    if (inst->IsDecoration()) {
      get_decoration_mgr()->AddDecoration(inst);
    }
  }
  if (AreAnalysesValid(kAnalysisDebugInfo)) {
    get_debug_info_mgr()->AnalyzeDebugInst(inst);
  }
  if (id_to_name_ && (inst->opcode() == spv::Op::OpName ||
                      inst->opcode() == spv::Op::OpMemberName)) {
    id_to_name_->insert({inst->GetSingleWordInOperand(0), inst});
  }
}